

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGB4444ToARGBRow_C(uint8_t *src_argb4444,uint8_t *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t a;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb4444_local;
  
  dst_argb_local = dst_argb;
  src_argb4444_local = src_argb4444;
  for (x = 0; x < width; x = x + 1) {
    bVar2 = (byte)((int)(uint)*src_argb4444_local >> 4);
    bVar1 = src_argb4444_local[1];
    bVar3 = (byte)((int)(uint)src_argb4444_local[1] >> 4);
    *dst_argb_local = (*src_argb4444_local & 0xf) << 4 | *src_argb4444_local & 0xf;
    dst_argb_local[1] = bVar2 << 4 | bVar2;
    dst_argb_local[2] = (bVar1 & 0xf) << 4 | bVar1 & 0xf;
    dst_argb_local[3] = bVar3 << 4 | bVar3;
    dst_argb_local = dst_argb_local + 4;
    src_argb4444_local = src_argb4444_local + 2;
  }
  return;
}

Assistant:

void ARGB4444ToARGBRow_C(const uint8_t* src_argb4444,
                         uint8_t* dst_argb,
                         int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb4444[0] & 0x0f;
    uint8_t g = src_argb4444[0] >> 4;
    uint8_t r = src_argb4444[1] & 0x0f;
    uint8_t a = src_argb4444[1] >> 4;
    dst_argb[0] = (b << 4) | b;
    dst_argb[1] = (g << 4) | g;
    dst_argb[2] = (r << 4) | r;
    dst_argb[3] = (a << 4) | a;
    dst_argb += 4;
    src_argb4444 += 2;
  }
}